

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

int mpt::type_properties<mpt::client_*>::id(bool obtain)

{
  int local_c;
  bool obtain_local;
  
  if (id::traits == (named_traits *)0x0) {
    if (obtain) {
      id::traits = client::pointer_traits();
      if (id::traits == (named_traits *)0x0) {
        local_c = -3;
      }
      else {
        local_c = (int)id::traits->type;
      }
    }
    else {
      local_c = -3;
    }
  }
  else {
    local_c = (int)id::traits->type;
  }
  return local_c;
}

Assistant:

int type_properties<client *>::id(bool obtain)
{
	static const named_traits *traits = 0;
	if (traits) {
		return traits->type;
	}
	if (!obtain) {
		return BadType;
	}
	if ((traits = client::pointer_traits())) {
		return traits->type;
	}
	return BadType;
}